

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_is4(stbi__context *s,char *str)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  long lVar5;
  
  psVar1 = s->buffer_start;
  lVar5 = 0;
  do {
    psVar4 = s->img_buffer;
    if (psVar4 < s->img_buffer_end) {
LAB_0011ffa5:
      s->img_buffer = psVar4 + 1;
      sVar2 = *psVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar3 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar1;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar1 + iVar3;
        }
        psVar4 = s->img_buffer;
        goto LAB_0011ffa5;
      }
      sVar2 = '\0';
    }
    if (sVar2 != str[lVar5]) {
      return 0;
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 4) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_is4(stbi__context *s,const char *str)
{
   int i;
   for (i=0; i<4; ++i)
      if (stbi__get8(s) != (stbi_uc)str[i])
         return 0;

   return 1;
}